

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_console_outputter.hpp
# Opt level: O0

void __thiscall
hayai::ConsoleOutputter::EndTest
          (ConsoleOutputter *this,string *fixtureName,string *testName,
          TestParametersDescriptor *parameters,TestResult *result)

{
  ostream *poVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  TextColor local_170 [3];
  TextColor local_164;
  TextColor local_160;
  int local_15c;
  double local_158;
  double _d__7;
  TextColor local_148;
  int local_144;
  double local_140;
  double _d__6;
  int local_130;
  int local_12c;
  TextColor local_128 [3];
  TextColor local_11c;
  TextColor local_118;
  int local_114;
  double local_110;
  double _d__5;
  TextColor local_100;
  int local_fc;
  double local_f8;
  double _d__4;
  int local_e8;
  TextColor local_e4 [3];
  TextColor local_d8 [3];
  TextColor local_cc;
  TextColor local_c8;
  int local_c4;
  double local_c0;
  double _d__3;
  TextColor local_b0;
  int local_ac;
  double local_a8;
  double _d__2;
  int local_98;
  int local_94;
  TextColor local_90 [3];
  TextColor local_84;
  TextColor local_80;
  int local_7c;
  double local_78;
  double _d__1;
  TextColor local_68;
  int local_64;
  double local_60;
  double _d_;
  TextColor local_50;
  int local_4c;
  TextColor local_48 [3];
  TextColor local_3c [3];
  TestResult *local_30;
  TestResult *result_local;
  TestParametersDescriptor *parameters_local;
  string *testName_local;
  string *fixtureName_local;
  ConsoleOutputter *this_local;
  
  local_3c[2] = 3;
  local_30 = result;
  result_local = (TestResult *)parameters;
  parameters_local = (TestParametersDescriptor *)testName;
  testName_local = fixtureName;
  fixtureName_local = (string *)this;
  poVar1 = operator<<(this->_stream,local_3c + 2);
  poVar1 = std::operator<<(poVar1,"[     DONE ]");
  local_3c[1] = 7;
  poVar1 = operator<<(poVar1,local_3c + 1);
  std::operator<<(poVar1," ");
  Outputter::WriteTestNameToStream
            (this->_stream,testName_local,(string *)parameters_local,
             (TestParametersDescriptor *)result_local);
  local_3c[0] = TextDefault;
  poVar1 = operator<<(this->_stream,local_3c);
  poVar1 = std::operator<<(poVar1," (");
  local_48[2] = (TextColor)inja::std::setprecision(6);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_48[2]);
  dVar3 = TestResult::TimeTotal(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000000.0);
  poVar1 = std::operator<<(poVar1," ms)");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_48[1] = 2;
  poVar1 = operator<<(this->_stream,local_48 + 1);
  poVar1 = std::operator<<(poVar1,"[   RUNS   ] ");
  local_48[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_48);
  poVar1 = std::operator<<(poVar1,"       Average time: ");
  local_4c = (int)inja::std::setprecision(3);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_4c);
  dVar3 = TestResult::RunTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us ");
  poVar1 = std::operator<<(poVar1,"(");
  local_50 = TextBlue;
  poVar1 = operator<<(poVar1,&local_50);
  poVar1 = std::operator<<(poVar1,"~");
  dVar3 = TestResult::RunTimeStdDev(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us");
  _d_._4_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d_ + 4));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::RunTimeMinimum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  local_60 = dVar3 / 1000.0 - dVar4 / 1000.0;
  poVar1 = this->_stream;
  local_64 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_64);
  poVar1 = std::operator<<(poVar1,"Fastest time: ");
  dVar3 = TestResult::RunTimeMinimum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::RunTimeMinimum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  local_68 = TextGreen;
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    local_68 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_68);
  dVar3 = TestResult::RunTimeMinimum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_60);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::RunTimeMinimum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_60 * 100.0;
  dVar4 = TestResult::RunTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / (dVar4 / 1000.0));
  poVar1 = std::operator<<(poVar1," %");
  _d__1._4_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d__1 + 4));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::RunTimeMaximum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  local_78 = dVar3 / 1000.0 - dVar4 / 1000.0;
  poVar1 = this->_stream;
  local_7c = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_7c);
  poVar1 = std::operator<<(poVar1,"Slowest time: ");
  dVar3 = TestResult::RunTimeMaximum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::RunTimeMaximum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  local_80 = TextGreen;
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    local_80 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_80);
  dVar3 = TestResult::RunTimeMaximum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_78);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::RunTimeMaximum(local_30);
  dVar4 = TestResult::RunTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_78 * 100.0;
  dVar4 = TestResult::RunTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / (dVar4 / 1000.0));
  poVar1 = std::operator<<(poVar1," %");
  local_84 = TextDefault;
  poVar1 = operator<<(poVar1,&local_84);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_90[2] = (TextColor)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_90[2]);
  poVar1 = std::operator<<(poVar1,"Median time: ");
  dVar3 = TestResult::RunTimeMedian(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us (");
  local_90[1] = 4;
  poVar1 = operator<<(poVar1,local_90 + 1);
  poVar1 = std::operator<<(poVar1,"1st quartile: ");
  dVar3 = TestResult::RunTimeQuartile1(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us | 3rd quartile: ");
  dVar3 = TestResult::RunTimeQuartile3(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us");
  local_90[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_90);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_94 = (int)inja::std::setprecision(5);
  std::operator<<(poVar1,(_Setprecision)local_94);
  poVar1 = this->_stream;
  local_98 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_98);
  poVar1 = std::operator<<(poVar1,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  _d__2._4_4_ = inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,_d__2._4_4_);
  poVar1 = std::operator<<(poVar1,"Average performance: ");
  dVar3 = TestResult::RunsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," runs/s");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::RunsPerSecondMaximum(local_30);
  local_a8 = TestResult::RunsPerSecondAverage(local_30);
  local_a8 = dVar3 - local_a8;
  poVar1 = this->_stream;
  local_ac = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_ac);
  poVar1 = std::operator<<(poVar1,"Best performance: ");
  dVar3 = TestResult::RunsPerSecondMaximum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"runs/s");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::RunsPerSecondMaximum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  local_b0 = TextGreen;
  if (dVar3 < dVar4) {
    local_b0 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_b0);
  dVar3 = TestResult::RunsPerSecondMaximum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_a8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"runs/s");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::RunsPerSecondMaximum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_a8 * 100.0;
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / dVar4);
  poVar1 = std::operator<<(poVar1," %");
  _d__3._4_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d__3 + 4));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::RunsPerSecondMinimum(local_30);
  local_c0 = TestResult::RunsPerSecondAverage(local_30);
  local_c0 = dVar3 - local_c0;
  poVar1 = this->_stream;
  local_c4 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_c4);
  poVar1 = std::operator<<(poVar1,"Worst performance: ");
  dVar3 = TestResult::RunsPerSecondMinimum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"runs/s");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::RunsPerSecondMinimum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  local_c8 = TextGreen;
  if (dVar3 < dVar4) {
    local_c8 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_c8);
  dVar3 = TestResult::RunsPerSecondMinimum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"runs/s");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::RunsPerSecondMinimum(local_30);
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_c0 * 100.0;
  dVar4 = TestResult::RunsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / dVar4);
  poVar1 = std::operator<<(poVar1," %");
  local_cc = TextDefault;
  poVar1 = operator<<(poVar1,&local_cc);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_d8[2] = (TextColor)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_d8[2]);
  poVar1 = std::operator<<(poVar1,"Median performance: ");
  dVar3 = TestResult::RunsPerSecondMedian(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," runs/s (");
  local_d8[1] = 4;
  poVar1 = operator<<(poVar1,local_d8 + 1);
  poVar1 = std::operator<<(poVar1,"1st quartile: ");
  dVar3 = TestResult::RunsPerSecondQuartile1(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," | 3rd quartile: ");
  dVar3 = TestResult::RunsPerSecondQuartile3(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  local_d8[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_d8);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_e4[2] = (TextColor)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_e4[2]);
  poVar1 = std::operator<<(poVar1,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_e4[1] = 2;
  poVar1 = operator<<(this->_stream,local_e4 + 1);
  poVar1 = std::operator<<(poVar1,"[ITERATIONS] ");
  local_e4[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_e4);
  local_e8 = (int)inja::std::setprecision(3);
  poVar1 = std::operator<<(poVar1,(_Setprecision)local_e8);
  poVar1 = std::operator<<(poVar1,"       Average time: ");
  dVar3 = TestResult::IterationTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us ");
  poVar1 = std::operator<<(poVar1,"(");
  _d__4._4_4_ = 2;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d__4 + 4));
  poVar1 = std::operator<<(poVar1,"~");
  dVar3 = TestResult::IterationTimeStdDev(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us");
  _d__4._0_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)&_d__4);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::IterationTimeMinimum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  local_f8 = dVar3 / 1000.0 - dVar4 / 1000.0;
  poVar1 = this->_stream;
  local_fc = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_fc);
  poVar1 = std::operator<<(poVar1,"Fastest time: ");
  dVar3 = TestResult::IterationTimeMinimum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::IterationTimeMinimum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  local_100 = TextGreen;
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    local_100 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_100);
  dVar3 = TestResult::IterationTimeMinimum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_f8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::IterationTimeMinimum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_f8 * 100.0;
  dVar4 = TestResult::IterationTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / (dVar4 / 1000.0));
  poVar1 = std::operator<<(poVar1," %");
  _d__5._4_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d__5 + 4));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::IterationTimeMaximum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  local_110 = dVar3 / 1000.0 - dVar4 / 1000.0;
  poVar1 = this->_stream;
  local_114 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_114);
  poVar1 = std::operator<<(poVar1,"Slowest time: ");
  dVar3 = TestResult::IterationTimeMaximum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::IterationTimeMaximum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  local_118 = TextGreen;
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    local_118 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_118);
  dVar3 = TestResult::IterationTimeMaximum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_110);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"us");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::IterationTimeMaximum(local_30);
  dVar4 = TestResult::IterationTimeAverage(local_30);
  pcVar2 = "";
  if (dVar4 / 1000.0 < dVar3 / 1000.0) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_110 * 100.0;
  dVar4 = TestResult::IterationTimeAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / (dVar4 / 1000.0));
  poVar1 = std::operator<<(poVar1," %");
  local_11c = TextDefault;
  poVar1 = operator<<(poVar1,&local_11c);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_128[2] = (TextColor)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_128[2]);
  poVar1 = std::operator<<(poVar1,"Median time: ");
  dVar3 = TestResult::IterationTimeMedian(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us (");
  local_128[1] = 4;
  poVar1 = operator<<(poVar1,local_128 + 1);
  poVar1 = std::operator<<(poVar1,"1st quartile: ");
  dVar3 = TestResult::IterationTimeQuartile1(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us | 3rd quartile: ");
  dVar3 = TestResult::IterationTimeQuartile3(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / 1000.0);
  poVar1 = std::operator<<(poVar1," us");
  local_128[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_128);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_12c = (int)inja::std::setprecision(5);
  std::operator<<(poVar1,(_Setprecision)local_12c);
  poVar1 = this->_stream;
  local_130 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_130);
  poVar1 = std::operator<<(poVar1,"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  _d__6._4_4_ = inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,_d__6._4_4_);
  poVar1 = std::operator<<(poVar1,"Average performance: ");
  dVar3 = TestResult::IterationsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," iterations/s");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::IterationsPerSecondMaximum(local_30);
  local_140 = TestResult::IterationsPerSecondAverage(local_30);
  local_140 = dVar3 - local_140;
  poVar1 = this->_stream;
  local_144 = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_144);
  poVar1 = std::operator<<(poVar1,"Best performance: ");
  dVar3 = TestResult::IterationsPerSecondMaximum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"iterations/s");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::IterationsPerSecondMaximum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  local_148 = TextGreen;
  if (dVar3 < dVar4) {
    local_148 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_148);
  dVar3 = TestResult::IterationsPerSecondMaximum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_140);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"iterations/s");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::IterationsPerSecondMaximum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_140 * 100.0;
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / dVar4);
  poVar1 = std::operator<<(poVar1," %");
  _d__7._4_4_ = 0;
  poVar1 = operator<<(poVar1,(TextColor *)((long)&_d__7 + 4));
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  dVar3 = TestResult::IterationsPerSecondMinimum(local_30);
  local_158 = TestResult::IterationsPerSecondAverage(local_30);
  local_158 = dVar3 - local_158;
  poVar1 = this->_stream;
  local_15c = (int)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_15c);
  poVar1 = std::operator<<(poVar1,"Worst performance: ");
  dVar3 = TestResult::IterationsPerSecondMinimum(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"iterations/s");
  poVar1 = std::operator<<(poVar1," (");
  dVar3 = TestResult::IterationsPerSecondMinimum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  local_160 = TextGreen;
  if (dVar3 < dVar4) {
    local_160 = TextRed;
  }
  poVar1 = operator<<(poVar1,&local_160);
  dVar3 = TestResult::IterationsPerSecondMinimum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_158);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,"iterations/s");
  poVar1 = std::operator<<(poVar1," / ");
  dVar3 = TestResult::IterationsPerSecondMinimum(local_30);
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  pcVar2 = "";
  if (dVar4 < dVar3) {
    pcVar2 = "+";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  dVar3 = local_158 * 100.0;
  dVar4 = TestResult::IterationsPerSecondAverage(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3 / dVar4);
  poVar1 = std::operator<<(poVar1," %");
  local_164 = TextDefault;
  poVar1 = operator<<(poVar1,&local_164);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = this->_stream;
  local_170[2] = (TextColor)inja::std::setw(0x22);
  poVar1 = std::operator<<(poVar1,(_Setw)local_170[2]);
  poVar1 = std::operator<<(poVar1,"Median performance: ");
  dVar3 = TestResult::IterationsPerSecondMedian(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," iterations/s (");
  local_170[1] = 4;
  poVar1 = operator<<(poVar1,local_170 + 1);
  poVar1 = std::operator<<(poVar1,"1st quartile: ");
  dVar3 = TestResult::IterationsPerSecondQuartile1(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  poVar1 = std::operator<<(poVar1," | 3rd quartile: ");
  dVar3 = TestResult::IterationsPerSecondQuartile3(local_30);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar3);
  local_170[0] = TextDefault;
  poVar1 = operator<<(poVar1,local_170);
  poVar1 = std::operator<<(poVar1,")");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void EndTest(const std::string& fixtureName,
                             const std::string& testName,
                             const TestParametersDescriptor& parameters,
                             const TestResult& result)
        {
#define PAD(x) _stream << std::setw(34) << x << std::endl;
#define PAD_DEVIATION(description,                                      \
                      deviated,                                         \
                      average,                                          \
                      unit)                                             \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated < average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }
#define PAD_DEVIATION_INVERSE(description,                              \
                              deviated,                                 \
                              average,                                  \
                              unit)                                     \
            {                                                           \
                double _d_ =                                            \
                    double(deviated) - double(average);                 \
                                                                        \
                PAD(description <<                                      \
                    deviated << " " << unit << " (" <<                  \
                    (deviated > average ?                               \
                     Console::TextRed :                                 \
                     Console::TextGreen) <<                             \
                    (deviated > average ? "+" : "") <<                  \
                    _d_ << " " << unit << " / " <<                      \
                    (deviated > average ? "+" : "") <<                  \
                    (_d_ * 100.0 / average) << " %" <<                  \
                    Console::TextDefault << ")");                       \
            }

            _stream << Console::TextGreen << "[     DONE ]"
                    << Console::TextYellow << " ";
            WriteTestNameToStream(_stream, fixtureName, testName, parameters);
            _stream << Console::TextDefault << " ("
                    << std::setprecision(6)
                    << (result.TimeTotal() / 1000000.0) << " ms)"
                    << std::endl;

            _stream << Console::TextBlue << "[   RUNS   ] "
                    << Console::TextDefault
                    << "       Average time: "
                    << std::setprecision(3)
                    << result.RunTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.RunTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.RunTimeMinimum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.RunTimeMaximum() / 1000.0),
                                  (result.RunTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.RunTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunTimeQuartile1() / 1000.0 << " us | 3rd quartile: " <<
                result.RunTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.RunsPerSecondAverage() << " runs/s");
            PAD_DEVIATION("Best performance: ",
                          result.RunsPerSecondMaximum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD_DEVIATION("Worst performance: ",
                          result.RunsPerSecondMinimum(),
                          result.RunsPerSecondAverage(),
                          "runs/s");
            PAD("Median performance: " <<
                result.RunsPerSecondMedian() << " runs/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.RunsPerSecondQuartile1() << " | 3rd quartile: " <<
                result.RunsPerSecondQuartile3() <<
                Console::TextDefault << ")");

            PAD("");
            _stream << Console::TextBlue << "[ITERATIONS] "
                    << Console::TextDefault
                    << std::setprecision(3)
                    << "       Average time: "
                    << result.IterationTimeAverage() / 1000.0 << " us "
                    << "(" << Console::TextBlue << "~"
                    << result.IterationTimeStdDev() / 1000.0 << " us"
                    << Console::TextDefault << ")"
                    << std::endl;

            PAD_DEVIATION_INVERSE("Fastest time: ",
                                  (result.IterationTimeMinimum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD_DEVIATION_INVERSE("Slowest time: ",
                                  (result.IterationTimeMaximum() / 1000.0),
                                  (result.IterationTimeAverage() / 1000.0),
                                  "us");
            PAD("Median time: " <<
                result.IterationTimeMedian() / 1000.0 << " us (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationTimeQuartile1() / 1000.0 <<
                " us | 3rd quartile: " <<
                result.IterationTimeQuartile3() / 1000.0 << " us" <<
                Console::TextDefault << ")");

            _stream << std::setprecision(5);

            PAD("");
            PAD("Average performance: " <<
                result.IterationsPerSecondAverage() <<
                " iterations/s");
            PAD_DEVIATION("Best performance: ",
                          (result.IterationsPerSecondMaximum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD_DEVIATION("Worst performance: ",
                          (result.IterationsPerSecondMinimum()),
                          (result.IterationsPerSecondAverage()),
                          "iterations/s");
            PAD("Median performance: " <<
                result.IterationsPerSecondMedian() << " iterations/s (" <<
                Console::TextCyan << "1st quartile: " <<
                result.IterationsPerSecondQuartile1() <<
                " | 3rd quartile: " <<
                result.IterationsPerSecondQuartile3() <<
                Console::TextDefault << ")");

#undef PAD_DEVIATION_INVERSE
#undef PAD_DEVIATION
#undef PAD
        }